

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeFloatConstant(Builder *this,float f,bool specConstant)

{
  Id typeId;
  Op OVar1;
  Id IVar2;
  Instruction *this_00;
  mapped_type *this_01;
  undefined7 in_register_00000031;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  Instruction *c;
  
  typeId = makeFloatType(this,0x20);
  OVar1 = OpSpecConstant;
  if (((int)CONCAT71(in_register_00000031,specConstant) != 0) ||
     (IVar2 = findScalarConstant(this,OpTypeFloat,OpConstant,typeId,(uint)f), OVar1 = OpConstant,
     IVar2 == 0)) {
    this_00 = (Instruction *)::operator_new(0x60);
    IVar2 = this->uniqueId + 1;
    this->uniqueId = IVar2;
    this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
    this_00->resultId = IVar2;
    this_00->typeId = typeId;
    this_00->opCode = OVar1;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     &(this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    c = this_00;
    Instruction::addImmediateOperand(this_00,(uint)f);
    local_38._M_head_impl = this_00;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    local_38._M_head_impl._0_4_ = 0x16;
    this_01 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->groupedConstants,(key_type *)&local_38);
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(this_01,&c);
    Module::mapInstruction(&this->module,c);
    IVar2 = c->resultId;
  }
  return IVar2;
}

Assistant:

Id Builder::makeFloatConstant(float f, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;
    Id typeId = makeFloatType(32);
    union { float fl; unsigned int ui; } u;
    u.fl = f;
    unsigned value = u.ui;

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = findScalarConstant(OpTypeFloat, opcode, typeId, value);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(value);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeFloat].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}